

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtxml.cpp
# Opt level: O1

char * printContainer(SResource *res,char *container,char *restype,char *mimetype,char *id,
                     UErrorCode *status)

{
  size_t s;
  FileStream *pFVar1;
  UErrorCode *status_00;
  SResource *pSVar2;
  int32_t iVar3;
  int32_t srcLen;
  char *value;
  int32_t extraout_EDX;
  int32_t extraout_EDX_00;
  int32_t extraout_EDX_01;
  int32_t extraout_EDX_02;
  char *result;
  char *pcVar4;
  int iVar5;
  int32_t bufLen;
  UChar *desc;
  UChar *trans;
  char *buf;
  int32_t local_2a4;
  UErrorCode *local_2a0;
  UChar *local_298;
  char *local_290;
  UChar *local_288;
  SResource *local_280;
  char *local_278;
  UnicodeString local_270;
  UnicodeString local_230;
  UnicodeString local_1f0;
  UnicodeString local_1b0;
  UnicodeString local_170;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_2a0 = status;
  write_tabs(out);
  local_280 = res;
  value = SResource::getKeyString(res,srBundle);
  if ((value == (char *)0x0) || (pcVar4 = value, *value == '\0')) {
    pcVar4 = (char *)0x0;
  }
  local_290 = getID(id,pcVar4,result);
  pFVar1 = out;
  icu_63::UnicodeString::UnicodeString(&local_b0,"<");
  write_utf8_file(pFVar1,&local_b0);
  icu_63::UnicodeString::~UnicodeString(&local_b0);
  pFVar1 = out;
  icu_63::UnicodeString::UnicodeString(&local_f0,container);
  write_utf8_file(pFVar1,&local_f0);
  icu_63::UnicodeString::~UnicodeString(&local_f0);
  pcVar4 = local_290;
  printAttribute("id",local_290,extraout_EDX);
  iVar3 = extraout_EDX_00;
  if (value != (char *)0x0) {
    printAttribute("resname",value,extraout_EDX_00);
    iVar3 = extraout_EDX_01;
  }
  if (mimetype != (char *)0x0) {
    printAttribute("mime-type",mimetype,iVar3);
    iVar3 = extraout_EDX_02;
  }
  if (restype != (char *)0x0) {
    printAttribute("restype",restype,iVar3);
  }
  pSVar2 = local_280;
  pFVar1 = out;
  tabCount = tabCount + 1;
  if ((local_280->fComment).fLength < 1) {
    icu_63::UnicodeString::UnicodeString(&local_130,">\n");
    write_utf8_file(pFVar1,&local_130);
    icu_63::UnicodeString::~UnicodeString(&local_130);
    return pcVar4;
  }
  if (local_2a0 == (UErrorCode *)0x0) {
    return pcVar4;
  }
  if (U_ZERO_ERROR < *local_2a0) {
    return pcVar4;
  }
  iVar5 = (local_280->fComment).fLength;
  local_278 = (char *)0x0;
  local_2a4 = 0;
  s = (long)iVar5 * 2 + 2;
  local_298 = (UChar *)uprv_malloc_63(s);
  local_288 = (UChar *)uprv_malloc_63(s);
  status_00 = local_2a0;
  if ((local_298 == (UChar *)0x0) || (local_288 == (UChar *)0x0)) {
    *local_2a0 = U_MEMORY_ALLOCATION_ERROR;
    goto LAB_0021a2d4;
  }
  iVar5 = iVar5 + 1;
  iVar3 = removeCmtText((pSVar2->fComment).fChars,(pSVar2->fComment).fLength,local_2a0);
  (pSVar2->fComment).fLength = iVar3;
  iVar3 = getDescription((pSVar2->fComment).fChars,iVar3,&local_298,iVar5,status_00);
  srcLen = getTranslate((pSVar2->fComment).fChars,(pSVar2->fComment).fLength,&local_288,iVar5,
                        status_00);
  pFVar1 = out;
  if (srcLen < 1) {
    icu_63::UnicodeString::UnicodeString(&local_270,">\n");
    write_utf8_file(pFVar1,&local_270);
LAB_0021a298:
    icu_63::UnicodeString::~UnicodeString(&local_270);
  }
  else {
    local_278 = convertAndEscape(&local_278,0,&local_2a4,local_288,srcLen,status_00);
    if (*status_00 < U_ILLEGAL_ARGUMENT_ERROR) {
      icu_63::UnicodeString::UnicodeString(&local_70,local_278,local_2a4,"UTF-8");
      pFVar1 = out;
      icu_63::UnicodeString::UnicodeString(&local_270," ");
      write_utf8_file(pFVar1,&local_270);
      icu_63::UnicodeString::~UnicodeString(&local_270);
      pFVar1 = out;
      icu_63::UnicodeString::UnicodeString(&local_170,"translate");
      write_utf8_file(pFVar1,&local_170);
      icu_63::UnicodeString::~UnicodeString(&local_170);
      pFVar1 = out;
      icu_63::UnicodeString::UnicodeString(&local_1b0," = \"");
      write_utf8_file(pFVar1,&local_1b0);
      icu_63::UnicodeString::~UnicodeString(&local_1b0);
      pFVar1 = out;
      icu_63::UnicodeString::UnicodeString(&local_1f0,&local_70);
      write_utf8_file(pFVar1,&local_1f0);
      icu_63::UnicodeString::~UnicodeString(&local_1f0);
      pFVar1 = out;
      icu_63::UnicodeString::UnicodeString(&local_230,"\"");
      write_utf8_file(pFVar1,&local_230);
      icu_63::UnicodeString::~UnicodeString(&local_230);
      icu_63::UnicodeString::~UnicodeString(&local_70);
      pFVar1 = out;
      icu_63::UnicodeString::UnicodeString(&local_270,">\n");
      write_utf8_file(pFVar1,&local_270);
      pcVar4 = local_290;
      goto LAB_0021a298;
    }
  }
  if (0 < iVar3) {
    write_tabs(out);
    print(local_298,iVar3,"<!--","-->",local_2a0);
  }
LAB_0021a2d4:
  uprv_free_63(local_298);
  uprv_free_63(local_288);
  return pcVar4;
}

Assistant:

static char *printContainer(SResource *res, const char *container, const char *restype, const char *mimetype, const char *id, UErrorCode *status)
{
    const char *resname = NULL;
    char *sid = NULL;

    write_tabs(out);

    resname = res->getKeyString(srBundle);
    if (resname != NULL && *resname != 0) {
        sid = getID(id, resname, sid);
    } else {
        sid = getID(id, NULL, sid);
    }

    write_utf8_file(out, UnicodeString("<"));
    write_utf8_file(out, UnicodeString(container));
    printAttribute("id", sid, (int32_t) uprv_strlen(sid));

    if (resname != NULL) {
        printAttribute("resname", resname, (int32_t) uprv_strlen(resname));
    }

    if (mimetype != NULL) {
        printAttribute("mime-type", mimetype, (int32_t) uprv_strlen(mimetype));
    }

    if (restype != NULL) {
        printAttribute("restype", restype, (int32_t) uprv_strlen(restype));
    }

    tabCount += 1;
    if (res->fComment.fLength > 0) {
        /* printComments will print the closing ">\n" */
        printComments(&res->fComment, resname, TRUE, status);
    } else {
        write_utf8_file(out, UnicodeString(">\n"));
    }

    return sid;
}